

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_aligned.h
# Opt level: O2

Split * __thiscall
embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::find
          (Split *__return_storage_ptr__,HeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *this,
          SetMB *set,size_t logBlockSize)

{
  vuint4 *pvVar1;
  float fVar2;
  undefined8 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  Vec3fa VVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  Vec3fa VVar14;
  int iVar15;
  unsigned_long uVar16;
  unsigned_long uVar17;
  __m128 afVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  Vec3fa VVar20;
  undefined1 auVar21 [16];
  BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *pBVar22;
  char cVar23;
  runtime_error *this_00;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *pBVar28;
  ulong uVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar30;
  long in_R9;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  BinMapping<32UL> mapping;
  ObjectBinner binner;
  task_group_context context;
  vfloat4 rAreas [32];
  undefined1 local_3790 [16];
  undefined1 local_3780 [8];
  float fStack_3778;
  float fStack_3774;
  undefined1 local_3770 [16];
  undefined1 local_3760 [16];
  undefined1 local_3750 [16];
  anon_class_8_1_b5464bae local_3740;
  PrimRefMB *local_3738;
  undefined1 local_3730 [16];
  undefined1 local_3720 [16];
  undefined1 local_3710 [16];
  anon_class_16_2_ed117de8_conflict16 local_3700;
  undefined1 local_36f0 [32];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_36d0;
  undefined1 local_36c0 [16];
  blocked_range<unsigned_long> local_36b0;
  undefined4 auStack_3698 [2];
  anon_class_16_2_be24578a_conflict local_3690;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3680;
  undefined1 local_3670 [16];
  undefined1 local_3660 [16];
  undefined1 local_3650 [16];
  undefined1 local_3640 [16];
  undefined1 local_3630 [16];
  undefined1 local_3620 [16];
  undefined1 local_3610 [16];
  undefined1 local_3600 [16];
  undefined1 local_35f0 [16];
  undefined1 local_35e0 [16];
  undefined1 local_35d0 [5972];
  undefined1 auStack_1e7c [4];
  longlong alStack_1e78 [61];
  char acStack_1c90 [16];
  task_group_context local_1c80 [3];
  undefined8 uStack_1a90;
  float afStack_1a88 [2];
  undefined1 local_1a80 [20];
  float afStack_1a6c [1679];
  
  pBVar22 = (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)
            (local_35d0 + 0x1750);
  pBVar28 = pBVar22;
  for (lVar25 = 0xb0; lVar25 != 0x18b0; lVar25 = lVar25 + 0xc0) {
    *(undefined4 *)((long)&local_36b0.my_end + lVar25) = 0x7f800000;
    *(undefined4 *)((long)&local_36b0.my_end + lVar25 + 4) = 0x7f800000;
    *(undefined4 *)((long)&local_36b0.my_begin + lVar25) = 0x7f800000;
    *(undefined4 *)((long)&local_36b0.my_begin + lVar25 + 4) = 0x7f800000;
    *(undefined4 *)((long)auStack_3698 + lVar25 + -8) = 0xff800000;
    *(undefined4 *)((long)auStack_3698 + lVar25 + -4) = 0xff800000;
    *(undefined4 *)((long)auStack_3698 + lVar25) = 0xff800000;
    *(undefined4 *)((long)auStack_3698 + lVar25 + 4) = 0xff800000;
    *(undefined4 *)((long)&local_3690.prims + lVar25) = 0x7f800000;
    *(undefined4 *)((long)&local_3690.prims + lVar25 + 4) = 0x7f800000;
    *(undefined4 *)((long)&local_3690.mapping + lVar25) = 0x7f800000;
    *(undefined4 *)((long)&local_3690.mapping + lVar25 + 4U) = 0x7f800000;
    *(undefined4 *)
     ((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->
             _bounds[0][0].bounds0.lower.field_0 + lVar25) = 0xff800000;
    *(undefined4 *)
     ((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->
             _bounds[0][0].bounds0.lower.field_0 + lVar25 + 4) = 0xff800000;
    *(undefined4 *)
     ((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->
             _bounds[0][0].bounds0.lower.field_0 + lVar25 + 8) = 0xff800000;
    *(undefined4 *)
     ((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->
             _bounds[0][0].bounds0.lower.field_0 + lVar25 + 0xc) = 0xff800000;
    *(undefined4 *)(local_36f0 + lVar25) = 0x7f800000;
    *(undefined4 *)(local_36f0 + lVar25 + 4) = 0x7f800000;
    *(undefined4 *)(local_36f0 + lVar25 + 8) = 0x7f800000;
    *(undefined4 *)(local_36f0 + lVar25 + 0xc) = 0x7f800000;
    *(undefined4 *)(local_36f0 + lVar25 + 0x10) = 0xff800000;
    *(undefined4 *)(local_36f0 + lVar25 + 0x14) = 0xff800000;
    *(undefined4 *)(local_36f0 + lVar25 + 0x18) = 0xff800000;
    *(undefined4 *)(local_36f0 + lVar25 + 0x1c) = 0xff800000;
    *(undefined4 *)((long)&local_36d0 + lVar25) = 0x7f800000;
    *(undefined4 *)((long)&local_36d0 + lVar25 + 4) = 0x7f800000;
    *(undefined4 *)((long)&local_36d0 + lVar25 + 8) = 0x7f800000;
    *(undefined4 *)((long)&local_36d0 + lVar25 + 0xc) = 0x7f800000;
    *(undefined4 *)(local_36c0 + lVar25) = 0xff800000;
    *(undefined4 *)(local_36c0 + lVar25 + 4) = 0xff800000;
    *(undefined4 *)(local_36c0 + lVar25 + 8) = 0xff800000;
    *(undefined4 *)(local_36c0 + lVar25 + 0xc) = 0xff800000;
    *(undefined4 *)(local_3730 + lVar25) = 0x7f800000;
    *(undefined4 *)(local_3730 + lVar25 + 4) = 0x7f800000;
    *(undefined4 *)(local_3730 + lVar25 + 8) = 0x7f800000;
    *(undefined4 *)(local_3730 + lVar25 + 0xc) = 0x7f800000;
    *(undefined4 *)(local_3720 + lVar25) = 0xff800000;
    *(undefined4 *)(local_3720 + lVar25 + 4) = 0xff800000;
    *(undefined4 *)(local_3720 + lVar25 + 8) = 0xff800000;
    *(undefined4 *)(local_3720 + lVar25 + 0xc) = 0xff800000;
    *(undefined4 *)(local_3710 + lVar25) = 0x7f800000;
    *(undefined4 *)(local_3710 + lVar25 + 4) = 0x7f800000;
    *(undefined4 *)(local_3710 + lVar25 + 8) = 0x7f800000;
    *(undefined4 *)(local_3710 + lVar25 + 0xc) = 0x7f800000;
    *(undefined4 *)((long)&local_3700.reduction + lVar25) = 0xff800000;
    *(undefined4 *)((long)&local_3700.reduction + lVar25 + 4) = 0xff800000;
    *(undefined4 *)((long)&local_3700.func + lVar25) = 0xff800000;
    *(undefined4 *)((long)&local_3700.func + lVar25 + 4) = 0xff800000;
    (((vuint4 *)pBVar28)->field_0).v[0] = 0;
    (((vuint4 *)pBVar28)->field_0).v[1] = 0;
    pBVar28 = (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)
              ((long)pBVar28 + 0x10);
  }
  uVar16 = (set->super_PrimInfoMB).object_range._begin;
  uVar17 = (set->super_PrimInfoMB).object_range._end;
  uVar26 = uVar17 - uVar16;
  local_3750._8_4_ = 0x7f800000;
  local_3750._0_8_ = 0x7f8000007f800000;
  local_3750._12_4_ = 0x7f800000;
  local_3760._8_4_ = 0xff800000;
  local_3760._0_8_ = 0xff800000ff800000;
  local_3760._12_4_ = 0xff800000;
  fVar34 = (float)uVar26 * 0.05 + 4.0;
  uVar29 = (ulong)fVar34;
  uVar29 = (long)(fVar34 - 9.223372e+18) & (long)uVar29 >> 0x3f | uVar29;
  local_36f0._0_8_ = 0x20;
  if (uVar29 < 0x20) {
    local_36f0._0_8_ = uVar29;
  }
  local_36f0._16_16_ =
       *(undefined1 (*) [16])
        (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
        field_0.m128;
  auVar21 = vsubps_avx((undefined1  [16])
                       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       centBounds.upper.field_0,local_36f0._16_16_);
  auVar41._8_4_ = 0x704ec3d;
  auVar41._0_8_ = 0x704ec3d0704ec3d;
  auVar41._12_4_ = 0x704ec3d;
  auVar44 = vmaxps_avx(auVar41,auVar21);
  auVar21 = vcmpps_avx(auVar44,auVar41,6);
  auVar41 = vshufps_avx(ZEXT416((uint)((float)(long)local_36f0._0_8_ * 0.99)),
                        ZEXT416((uint)((float)(long)local_36f0._0_8_ * 0.99)),0);
  auVar44 = vdivps_avx(auVar41,auVar44);
  afVar18 = (__m128)vandps_avx(auVar21,auVar44);
  local_36d0.i[0] = (int)afVar18[0];
  local_36d0.i[1] = (int)afVar18[1];
  local_36d0.i[2] = (int)afVar18[2];
  local_36d0.i[3] = (int)afVar18[3];
  local_3738 = set->prims->items;
  if (uVar26 < 0xc00) {
    if (uVar17 != uVar16) {
      local_3738 = local_3738 + uVar16;
      auVar21 = vpshufd_avx(ZEXT416((int)local_36f0._0_8_ - 1),0);
      local_3780._0_4_ = afVar18[0];
      local_3780._4_4_ = afVar18[1];
      fStack_3778 = afVar18[2];
      fStack_3774 = afVar18[3];
      for (uVar29 = 0; uVar29 < uVar26 - 1; uVar29 = uVar29 + 2) {
        aVar4 = (local_3738->lbounds).bounds0.lower.field_0.field_1;
        aVar5 = (local_3738->lbounds).bounds0.upper.field_0.field_1;
        aVar6 = (local_3738->lbounds).bounds1.lower.field_0.field_1;
        aVar7 = (local_3738->lbounds).bounds1.upper.field_0.field_1;
        auVar44._0_4_ = aVar4.x * 0.5 + aVar6.x * 0.5 + aVar5.x * 0.5 + aVar7.x * 0.5;
        auVar44._4_4_ = aVar4.y * 0.5 + aVar6.y * 0.5 + aVar5.y * 0.5 + aVar7.y * 0.5;
        auVar44._8_4_ = aVar4.z * 0.5 + aVar6.z * 0.5 + aVar5.z * 0.5 + aVar7.z * 0.5;
        auVar44._12_4_ =
             aVar4.field_3.w * 0.5 + aVar6.field_3.w * 0.5 +
             aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5;
        auVar44 = vsubps_avx(auVar44,local_36f0._16_16_);
        auVar45._0_4_ = (float)local_3780._0_4_ * auVar44._0_4_;
        auVar45._4_4_ = (float)local_3780._4_4_ * auVar44._4_4_;
        auVar45._8_4_ = fStack_3778 * auVar44._8_4_;
        auVar45._12_4_ = fStack_3774 * auVar44._12_4_;
        auVar44 = vroundps_avx(auVar45,1);
        auVar44 = vcvtps2dq_avx(auVar44);
        auVar44 = vpminsd_avx(auVar44,auVar21);
        auVar44 = vpmaxsd_avx(auVar44,ZEXT816(0) << 0x40);
        aVar8 = local_3738[1].lbounds.bounds0.lower.field_0.field_1;
        aVar9 = local_3738[1].lbounds.bounds0.upper.field_0.field_1;
        aVar10 = local_3738[1].lbounds.bounds1.lower.field_0.field_1;
        aVar11 = local_3738[1].lbounds.bounds1.upper.field_0.field_1;
        auVar43._0_4_ = aVar8.x * 0.5 + aVar10.x * 0.5 + aVar11.x * 0.5 + aVar9.x * 0.5;
        auVar43._4_4_ = aVar8.y * 0.5 + aVar10.y * 0.5 + aVar11.y * 0.5 + aVar9.y * 0.5;
        auVar43._8_4_ = aVar8.z * 0.5 + aVar10.z * 0.5 + aVar11.z * 0.5 + aVar9.z * 0.5;
        auVar43._12_4_ =
             aVar8.field_3.w * 0.5 + aVar10.field_3.w * 0.5 +
             aVar11.field_3.w * 0.5 + aVar9.field_3.w * 0.5;
        lVar25 = CONCAT44((int)((ulong)in_R9 >> 0x20),auVar44._0_4_);
        VVar12.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + lVar25 * 0xc0);
        aVar13 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0 + 0xfffffffffffffff0);
        VVar14.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0);
        aVar19.m128 = (__m128)vminps_avx(((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                           *)&local_3680)->_bounds[lVar25][0].bounds0.lower.field_0,
                                         (undefined1  [16])aVar4);
        ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->_bounds
        [lVar25][0].bounds0.lower.field_0 = aVar19;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar12.field_0,(undefined1  [16])aVar5);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + lVar25 * 0xc0) = VVar12.field_0;
        aVar13.m128 = (__m128)vminps_avx(aVar13.m128,(undefined1  [16])aVar6);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0 + 0xfffffffffffffff0) = aVar13;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar14.field_0,(undefined1  [16])aVar7);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0) = VVar12.field_0;
        uVar31 = (ulong)auVar44._4_4_;
        VVar12.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar31 * 0xc0);
        aVar13 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar31 * 0xc0 + 0xfffffffffffffff0);
        VVar14.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar31 * 0xc0);
        VVar20.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vminps_avx((undefined1  [16])
                        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                         *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar31 * 0xc0),
                        (undefined1  [16])aVar4);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar31 * 0xc0) = VVar20.field_0;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar12.field_0,(undefined1  [16])aVar5);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar31 * 0xc0) = VVar12.field_0;
        aVar13.m128 = (__m128)vminps_avx(aVar13.m128,(undefined1  [16])aVar6);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar31 * 0xc0 + 0xfffffffffffffff0) = aVar13;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar14.field_0,(undefined1  [16])aVar7);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar31 * 0xc0) = VVar12.field_0;
        uVar32 = (ulong)auVar44._8_4_;
        lVar33 = uVar32 * 0xc0;
        auVar44 = *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1970);
        auVar41 = *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1960);
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vminps_avx((undefined1  [16])
                        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                         *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar32 * 0xc0),
                        (undefined1  [16])aVar4);
        auVar45 = *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1950);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar32 * 0xc0) = VVar12.field_0;
        auVar44 = vmaxps_avx(auVar44,(undefined1  [16])aVar5);
        *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1970) = auVar44;
        auVar44 = vsubps_avx(auVar43,local_36f0._16_16_);
        auVar46._0_4_ = (float)local_3780._0_4_ * auVar44._0_4_;
        auVar46._4_4_ = (float)local_3780._4_4_ * auVar44._4_4_;
        auVar46._8_4_ = fStack_3778 * auVar44._8_4_;
        auVar46._12_4_ = fStack_3774 * auVar44._12_4_;
        auVar44 = vroundps_avx(auVar46,1);
        auVar44 = vcvtps2dq_avx(auVar44);
        auVar44 = vpminsd_avx(auVar44,auVar21);
        auVar46 = vpmaxsd_avx(auVar44,_DAT_01f45a50);
        auVar44 = vminps_avx(auVar41,(undefined1  [16])aVar6);
        *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1960) = auVar44;
        auVar44 = vmaxps_avx(auVar45,(undefined1  [16])aVar7);
        *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1950) = auVar44;
        iVar24 = *(int *)((long)&(local_3738->lbounds).bounds1.lower.field_0 + 0xc);
        pvVar1 = (vuint4 *)(&pBVar22->_bounds[0][0].bounds0.lower + lVar25);
        (pvVar1->field_0).i[0] = (pvVar1->field_0).i[0] + iVar24;
        *(uint *)&((vuint4 *)(auStack_1e7c + uVar31 * 0x10))->field_0 =
             *(uint *)&((vuint4 *)(auStack_1e7c + uVar31 * 0x10))->field_0 + iVar24;
        *(uint *)&((vuint4 *)(alStack_1e78 + uVar32 * 2))->field_0 =
             *(uint *)&((vuint4 *)(alStack_1e78 + uVar32 * 2))->field_0 + iVar24;
        lVar25 = CONCAT44((int)((ulong)(lVar25 * 0x10) >> 0x20),auVar46._0_4_);
        VVar12.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + lVar25 * 0xc0);
        aVar13 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0 + 0xfffffffffffffff0);
        VVar14.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0);
        aVar19.m128 = (__m128)vminps_avx(((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                           *)&local_3680)->_bounds[lVar25][0].bounds0.lower.field_0,
                                         (undefined1  [16])aVar8);
        ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->_bounds
        [lVar25][0].bounds0.lower.field_0 = aVar19;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar12.field_0,(undefined1  [16])aVar9);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + lVar25 * 0xc0) = VVar12.field_0;
        aVar13.m128 = (__m128)vminps_avx(aVar13.m128,(undefined1  [16])aVar10);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0 + 0xfffffffffffffff0) = aVar13;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar14.field_0,(undefined1  [16])aVar11);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0) = VVar12.field_0;
        uVar31 = (ulong)auVar46._4_4_;
        VVar12.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar31 * 0xc0);
        aVar13 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar31 * 0xc0 + 0xfffffffffffffff0);
        VVar14.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar31 * 0xc0);
        VVar20.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vminps_avx((undefined1  [16])
                        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                         *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar31 * 0xc0),
                        (undefined1  [16])aVar8);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar31 * 0xc0) = VVar20.field_0;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar12.field_0,(undefined1  [16])aVar9);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar31 * 0xc0) = VVar12.field_0;
        aVar13.m128 = (__m128)vminps_avx(aVar13.m128,(undefined1  [16])aVar10);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar31 * 0xc0 + 0xfffffffffffffff0) = aVar13;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar14.field_0,(undefined1  [16])aVar11);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar31 * 0xc0) = VVar12.field_0;
        uVar32 = (ulong)auVar46._8_4_;
        lVar33 = uVar32 * 0xc0;
        auVar44 = *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1970);
        auVar41 = *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1960);
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vminps_avx((undefined1  [16])
                        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                         *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar32 * 0xc0),
                        (undefined1  [16])aVar8);
        auVar45 = *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1950);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar32 * 0xc0) = VVar12.field_0;
        auVar44 = vmaxps_avx(auVar44,(undefined1  [16])aVar9);
        *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1970) = auVar44;
        auVar44 = vminps_avx(auVar41,(undefined1  [16])aVar10);
        *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1960) = auVar44;
        auVar44 = vmaxps_avx(auVar45,(undefined1  [16])aVar11);
        *(undefined1 (*) [16])((long)local_1c80 + lVar33 + -0x1950) = auVar44;
        iVar24 = *(int *)((long)&local_3738[1].lbounds.bounds1.lower.field_0 + 0xc);
        in_R9 = lVar25 * 0x10;
        pvVar1 = (vuint4 *)(&pBVar22->_bounds[0][0].bounds0.lower + lVar25);
        (pvVar1->field_0).i[0] = (pvVar1->field_0).i[0] + iVar24;
        *(uint *)&((vuint4 *)(auStack_1e7c + uVar31 * 0x10))->field_0 =
             *(uint *)&((vuint4 *)(auStack_1e7c + uVar31 * 0x10))->field_0 + iVar24;
        *(uint *)&((vuint4 *)(alStack_1e78 + uVar32 * 2))->field_0 =
             *(uint *)&((vuint4 *)(alStack_1e78 + uVar32 * 2))->field_0 + iVar24;
        local_3738 = local_3738 + 2;
      }
      if (uVar29 < uVar26) {
        aVar4 = (local_3738->lbounds).bounds0.lower.field_0.field_1;
        aVar5 = (local_3738->lbounds).bounds0.upper.field_0.field_1;
        aVar6 = (local_3738->lbounds).bounds1.lower.field_0.field_1;
        aVar7 = (local_3738->lbounds).bounds1.upper.field_0.field_1;
        auVar35._0_4_ = aVar4.x * 0.5 + aVar6.x * 0.5 + aVar5.x * 0.5 + aVar7.x * 0.5;
        auVar35._4_4_ = aVar4.y * 0.5 + aVar6.y * 0.5 + aVar5.y * 0.5 + aVar7.y * 0.5;
        auVar35._8_4_ = aVar4.z * 0.5 + aVar6.z * 0.5 + aVar5.z * 0.5 + aVar7.z * 0.5;
        auVar35._12_4_ =
             aVar4.field_3.w * 0.5 + aVar6.field_3.w * 0.5 +
             aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5;
        auVar44 = vsubps_avx(auVar35,local_36f0._16_16_);
        auVar36._0_4_ = auVar44._0_4_ * (float)local_3780._0_4_;
        auVar36._4_4_ = auVar44._4_4_ * (float)local_3780._4_4_;
        auVar36._8_4_ = auVar44._8_4_ * fStack_3778;
        auVar36._12_4_ = auVar44._12_4_ * fStack_3774;
        auVar44 = vroundps_avx(auVar36,1);
        auVar44 = vcvtps2dq_avx(auVar44);
        auVar21 = vpminsd_avx(auVar44,auVar21);
        auVar21 = vpmaxsd_avx(auVar21,ZEXT416(0) << 0x20);
        iVar24 = vextractps_avx((undefined1  [16])aVar6,3);
        lVar25 = CONCAT44((int)((ulong)local_3738 >> 0x20),auVar21._0_4_);
        pvVar1 = (vuint4 *)(&pBVar22->_bounds[0][0].bounds0.lower + lVar25);
        (pvVar1->field_0).i[0] = (pvVar1->field_0).i[0] + iVar24;
        VVar12.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + lVar25 * 0xc0);
        aVar13 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0 + 0xfffffffffffffff0);
        VVar14.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0);
        aVar19.m128 = (__m128)vminps_avx(((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                           *)&local_3680)->_bounds[lVar25][0].bounds0.lower.field_0,
                                         (undefined1  [16])aVar4);
        ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->_bounds
        [lVar25][0].bounds0.lower.field_0 = aVar19;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar12.field_0,(undefined1  [16])aVar5);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + lVar25 * 0xc0) = VVar12.field_0;
        aVar13.m128 = (__m128)vminps_avx(aVar13.m128,(undefined1  [16])aVar6);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0 + 0xfffffffffffffff0) = aVar13;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar14.field_0,(undefined1  [16])aVar7);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + lVar25 * 0xc0) = VVar12.field_0;
        uVar26 = (ulong)auVar21._4_4_;
        *(uint *)&((vuint4 *)(auStack_1e7c + uVar26 * 0x10))->field_0 =
             *(uint *)&((vuint4 *)(auStack_1e7c + uVar26 * 0x10))->field_0 + iVar24;
        VVar12.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar26 * 0xc0);
        aVar13 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar26 * 0xc0 + 0xfffffffffffffff0);
        VVar14.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar26 * 0xc0);
        VVar20.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vminps_avx((undefined1  [16])
                        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                         *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar26 * 0xc0),
                        (undefined1  [16])aVar4);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar26 * 0xc0) = VVar20.field_0;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar12.field_0,(undefined1  [16])aVar5);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar26 * 0xc0) = VVar12.field_0;
        aVar13.m128 = (__m128)vminps_avx(aVar13.m128,(undefined1  [16])aVar6);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar26 * 0xc0 + 0xfffffffffffffff0) = aVar13;
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vmaxps_avx((undefined1  [16])VVar14.field_0,(undefined1  [16])aVar7);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar26 * 0xc0) = VVar12.field_0;
        uVar26 = (ulong)auVar21._8_4_;
        lVar25 = uVar26 * 0xc0;
        *(uint *)&((vuint4 *)(alStack_1e78 + uVar26 * 2))->field_0 =
             *(uint *)&((vuint4 *)(alStack_1e78 + uVar26 * 2))->field_0 + iVar24;
        auVar21 = *(undefined1 (*) [16])((long)local_1c80 + lVar25 + -0x1970);
        auVar44 = *(undefined1 (*) [16])((long)local_1c80 + lVar25 + -0x1960);
        auVar41 = *(undefined1 (*) [16])((long)local_1c80 + lVar25 + -0x1950);
        VVar12.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             vminps_avx((undefined1  [16])
                        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                         *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar26 * 0xc0),
                        (undefined1  [16])aVar4);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar26 * 0xc0) = VVar12.field_0;
        auVar21 = vmaxps_avx(auVar21,(undefined1  [16])aVar5);
        *(undefined1 (*) [16])((long)local_1c80 + lVar25 + -0x1970) = auVar21;
        auVar21 = vminps_avx(auVar44,(undefined1  [16])aVar6);
        *(undefined1 (*) [16])((long)local_1c80 + lVar25 + -0x1960) = auVar21;
        auVar21 = vmaxps_avx(auVar41,(undefined1  [16])aVar7);
        *(undefined1 (*) [16])((long)local_1c80 + lVar25 + -0x1950) = auVar21;
      }
    }
  }
  else {
    local_3690.prims = &local_3738;
    local_3740.mapping = (BinMapping<32UL> *)local_36f0;
    local_3690.mapping = local_3740.mapping;
    tbb::detail::d1::task_group_context::task_group_context
              (local_1c80,(context_traits)0x4,CUSTOM_CTX);
    local_36b0.my_begin = uVar16;
    local_36b0.my_end = uVar17;
    local_36b0.my_grainsize = 0x400;
    local_3700.func = &local_3690;
    local_3700.reduction = &local_3740;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::avx::BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:513:31)>
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_1a80,
               &local_36b0,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680,
               &local_3700,&local_3740,local_1c80);
    cVar23 = tbb::detail::r1::is_group_execution_cancelled(local_1c80);
    if (cVar23 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(local_1c80);
    BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_1a80);
  }
  lVar27 = local_36f0._0_8_ * 0xc0 + -0x10;
  lVar25 = local_36f0._0_8_ * 0x10 + 0x17f0;
  auVar36 = ZEXT816(0) << 0x40;
  auVar49._8_4_ = 0x7f800000;
  auVar49._0_8_ = 0x7f8000007f800000;
  auVar49._12_4_ = 0x7f800000;
  auVar51._8_4_ = 0xff800000;
  auVar51._0_8_ = 0xff800000ff800000;
  auVar51._12_4_ = 0xff800000;
  lVar33 = local_36f0._0_8_ * 0x10;
  auVar41 = auVar51;
  auVar45 = auVar51;
  auVar46 = auVar49;
  auVar21 = auVar51;
  auVar43 = auVar49;
  auVar44 = auVar51;
  auVar35 = auVar49;
  local_3790 = auVar49;
  for (uVar26 = 1; local_36f0._0_8_ != uVar26; uVar26 = uVar26 + 1) {
    auVar46 = vminps_avx(auVar46,*(undefined1 (*) [16])(local_3730 + lVar27));
    auVar21 = vmaxps_avx(auVar21,*(undefined1 (*) [16])(local_3720 + lVar27));
    auVar43 = vminps_avx(auVar43,*(undefined1 (*) [16])(local_3710 + lVar27));
    auVar44 = vmaxps_avx(auVar44,*(undefined1 (*) [16])((long)&local_3700.reduction + lVar27));
    auVar53 = vsubps_avx(auVar21,auVar46);
    auVar40 = vsubps_avx(auVar44,auVar43);
    local_3790 = vminps_avx(local_3790,*(undefined1 (*) [16])(local_36f0 + lVar27));
    auVar41 = vmaxps_avx(auVar41,*(undefined1 (*) [16])(local_36f0 + lVar27 + 0x10));
    auVar49 = vminps_avx(auVar49,*(undefined1 (*) [16])((long)&local_36d0 + lVar27));
    auVar45 = vmaxps_avx(auVar45,*(undefined1 (*) [16])(local_36c0 + lVar27));
    auVar39 = vsubps_avx(auVar41,local_3790);
    auVar38 = vinsertps_avx(auVar39,auVar53,0x4c);
    auVar52 = vshufpd_avx(auVar53,auVar53,1);
    auVar52 = vinsertps_avx(auVar52,auVar39,0x9c);
    auVar37 = vsubps_avx(auVar45,auVar49);
    auVar42 = vunpcklps_avx(auVar53,auVar39);
    auVar53 = vinsertps_avx(auVar37,auVar40,0x4c);
    auVar39 = vshufpd_avx(auVar40,auVar40,1);
    auVar39 = vinsertps_avx(auVar39,auVar37,0x9c);
    auVar40 = vunpcklps_avx(auVar40,auVar37);
    auVar37._0_4_ =
         (auVar42._0_4_ * (auVar38._0_4_ + auVar52._0_4_) + auVar38._0_4_ * auVar52._0_4_ +
         auVar40._0_4_ * (auVar39._0_4_ + auVar53._0_4_) + auVar39._0_4_ * auVar53._0_4_) * 0.5;
    auVar37._4_4_ =
         (auVar42._4_4_ * (auVar38._4_4_ + auVar52._4_4_) + auVar38._4_4_ * auVar52._4_4_ +
         auVar40._4_4_ * (auVar39._4_4_ + auVar53._4_4_) + auVar39._4_4_ * auVar53._4_4_) * 0.5;
    auVar37._8_4_ =
         (auVar42._8_4_ * (auVar38._8_4_ + auVar52._8_4_) + auVar38._8_4_ * auVar52._8_4_ +
         auVar40._8_4_ * (auVar39._8_4_ + auVar53._8_4_) + auVar39._8_4_ * auVar53._8_4_) * 0.5;
    auVar37._12_4_ =
         (auVar42._12_4_ * (auVar38._12_4_ + auVar52._12_4_) + auVar38._12_4_ * auVar52._12_4_ +
         auVar40._12_4_ * (auVar39._12_4_ + auVar53._12_4_) + auVar39._12_4_ * auVar53._12_4_) * 0.5
    ;
    local_3750 = vminps_avx(local_3750,*(undefined1 (*) [16])((long)&local_36b0.my_end + lVar27));
    local_3760 = vmaxps_avx(local_3760,*(undefined1 (*) [16])((long)auStack_3698 + lVar27 + -8));
    auVar35 = vminps_avx(auVar35,*(undefined1 (*) [16])((long)&local_3690.prims + lVar27));
    auVar51 = vmaxps_avx(auVar51,*(undefined1 (*) [16])
                                  ((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                            *)&local_3680)->_bounds[0][0].bounds0.lower.field_0 +
                                  lVar27));
    uVar3 = vmovlps_avx(auVar37);
    *(undefined8 *)((long)&uStack_1a90 + lVar33) = uVar3;
    auVar40 = vsubps_avx(local_3760,local_3750);
    auVar38 = vmovshdup_avx(auVar40);
    auVar53 = vshufpd_avx(auVar40,auVar40,1);
    auVar37 = vsubps_avx(auVar51,auVar35);
    auVar52 = vmovshdup_avx(auVar37);
    auVar39 = vshufpd_avx(auVar37,auVar37,1);
    *(float *)((long)afStack_1a88 + lVar33) =
         ((auVar53._0_4_ + auVar38._0_4_) * auVar40._0_4_ + auVar53._0_4_ * auVar38._0_4_ +
         auVar52._0_4_ * auVar39._0_4_ + (auVar52._0_4_ + auVar39._0_4_) * auVar37._0_4_) * 0.5;
    auVar36 = vpaddd_avx(auVar36,*(undefined1 (*) [16])
                                  ((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                            *)&local_3680)->_bounds[0][0].bounds0.lower.field_0 +
                                  lVar25));
    *(undefined1 (*) [16])(local_1c80[0].padding + lVar33 + -0x58) = auVar36;
    *(undefined4 *)((long)afStack_1a88 + lVar33 + 4) = 0;
    lVar27 = lVar27 + -0xc0;
    lVar25 = lVar25 + -0x10;
    lVar33 = lVar33 + -0x10;
  }
  uVar26 = 0xffffffffffffffff;
  local_36c0 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
  uVar29 = 1;
  auVar45 = ZEXT816(0) << 0x40;
  auVar38._8_4_ = 0xff800000;
  auVar38._0_8_ = 0xff800000ff800000;
  auVar38._12_4_ = 0xff800000;
  auVar53._8_8_ = 0x100000001;
  auVar53._0_8_ = 0x100000001;
  auVar52._8_4_ = 0x7f800000;
  auVar52._0_8_ = 0x7f8000007f800000;
  auVar52._12_4_ = 0x7f800000;
  local_3700 = (anon_class_16_2_ed117de8_conflict16)(ZEXT816(0) << 0x40);
  paVar30 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_35d0;
  lVar25 = 0;
  local_3710 = auVar38;
  local_3720 = auVar52;
  local_3730 = auVar38;
  auVar21 = auVar38;
  auVar44 = auVar52;
  auVar41 = auVar52;
  local_3790 = auVar38;
  _local_3780 = auVar52;
  local_3770 = auVar38;
  local_3760 = auVar52;
  local_3750 = auVar52;
  while (uVar29 < (ulong)local_36f0._0_8_) {
    auVar44 = vminps_avx(auVar44,(undefined1  [16])paVar30[-0xb]);
    auVar21 = vmaxps_avx(auVar21,(undefined1  [16])paVar30[-10]);
    auVar41 = vminps_avx(auVar41,(undefined1  [16])paVar30[-9]);
    auVar38 = vmaxps_avx(auVar38,(undefined1  [16])paVar30[-8]);
    auVar35 = vsubps_avx(auVar21,auVar44);
    _local_3780 = vminps_avx(_local_3780,(undefined1  [16])paVar30[-7]);
    local_3710 = vmaxps_avx(local_3710,(undefined1  [16])paVar30[-6]);
    local_3720 = vminps_avx(local_3720,(undefined1  [16])paVar30[-5]);
    auVar36 = vsubps_avx(auVar38,auVar41);
    local_3730 = vmaxps_avx(local_3730,(undefined1  [16])paVar30[-4]);
    auVar51 = vsubps_avx(local_3710,_local_3780);
    auVar49 = vsubps_avx(local_3730,local_3720);
    auVar46 = vinsertps_avx(auVar49,auVar36,0x4c);
    auVar43 = vshufpd_avx(auVar36,auVar36,1);
    auVar43 = vinsertps_avx(auVar43,auVar49,0x9c);
    auVar36 = vunpcklps_avx(auVar36,auVar49);
    local_3750 = vminps_avx(local_3750,(undefined1  [16])paVar30[-3]);
    local_3790 = vmaxps_avx(local_3790,(undefined1  [16])paVar30[-2]);
    local_3760 = vminps_avx(local_3760,(undefined1  [16])paVar30[-1]);
    local_3770 = vmaxps_avx(local_3770,(undefined1  [16])*paVar30);
    auVar39._0_4_ = (auVar43._0_4_ + auVar46._0_4_) * auVar36._0_4_ + auVar43._0_4_ * auVar46._0_4_;
    auVar39._4_4_ = (auVar43._4_4_ + auVar46._4_4_) * auVar36._4_4_ + auVar43._4_4_ * auVar46._4_4_;
    auVar39._8_4_ = (auVar43._8_4_ + auVar46._8_4_) * auVar36._8_4_ + auVar43._8_4_ * auVar46._8_4_;
    auVar39._12_4_ =
         (auVar43._12_4_ + auVar46._12_4_) * auVar36._12_4_ + auVar43._12_4_ * auVar46._12_4_;
    auVar36 = vsubps_avx(local_3790,local_3750);
    auVar49 = vsubps_avx(local_3770,local_3760);
    auVar46 = vinsertps_avx(auVar51,auVar35,0x4c);
    auVar46 = vshufps_avx(auVar46,auVar49,0xd4);
    auVar46 = vinsertps_avx(auVar46,auVar36,0x70);
    auVar43 = vunpckhps_avx(auVar35,auVar51);
    auVar50._0_8_ = auVar43._0_8_;
    auVar50._8_8_ = auVar49._8_8_;
    auVar43 = vinsertps_avx(auVar50,auVar36,0xb0);
    auVar35 = vunpcklps_avx(auVar35,auVar51);
    auVar35 = vmovlhps_avx(auVar35,auVar49);
    auVar45 = vpaddd_avx(auVar45,*(undefined1 (*) [16])(local_35d0 + lVar25 + 0x1750));
    auVar35 = vinsertps_avx(auVar35,auVar36,0x30);
    auVar42._0_4_ = auVar46._0_4_ * auVar43._0_4_ + (auVar46._0_4_ + auVar43._0_4_) * auVar35._0_4_;
    auVar42._4_4_ = auVar46._4_4_ * auVar43._4_4_ + (auVar46._4_4_ + auVar43._4_4_) * auVar35._4_4_;
    auVar42._8_4_ = auVar46._8_4_ * auVar43._8_4_ + (auVar46._8_4_ + auVar43._8_4_) * auVar35._8_4_;
    auVar42._12_4_ =
         auVar46._12_4_ * auVar43._12_4_ + (auVar46._12_4_ + auVar43._12_4_) * auVar35._12_4_;
    auVar49 = vshufps_avx(auVar39,auVar42,0xb4);
    auVar46 = vpaddd_avx(auVar45,local_36c0);
    auVar43 = vpsrld_avx(auVar46,ZEXT416((uint)logBlockSize));
    auVar46 = vpaddd_avx(local_36c0,*(undefined1 (*) [16])(local_1c80[0].padding + lVar25 + -0x38));
    auVar51 = vpsrld_avx(auVar46,ZEXT416((uint)logBlockSize));
    auVar46 = vpsrad_avx(auVar43,0x1f);
    auVar47._8_8_ = 0x4f0000004f000000;
    auVar47._0_8_ = 0x4f0000004f000000;
    auVar35 = vpand_avx(auVar46,auVar47);
    auVar48._8_4_ = 0x7fffffff;
    auVar48._0_8_ = 0x7fffffff7fffffff;
    auVar48._12_4_ = 0x7fffffff;
    auVar46 = vpand_avx(auVar48,auVar43);
    auVar46 = vcvtdq2ps_avx(auVar46);
    auVar43 = vpsrad_avx(auVar51,0x1f);
    auVar36 = vpand_avx(auVar43,auVar47);
    auVar43 = vpand_avx(auVar48,auVar51);
    auVar43 = vcvtdq2ps_avx(auVar43);
    auVar40._0_4_ =
         (auVar46._0_4_ + auVar35._0_4_) * (auVar42._0_4_ + auVar49._0_4_) * 0.5 +
         (auVar43._0_4_ + auVar36._0_4_) * *(float *)(local_1a80 + lVar25 + 0x10);
    auVar40._4_4_ =
         (auVar46._4_4_ + auVar35._4_4_) * (auVar42._4_4_ + auVar49._4_4_) * 0.5 +
         (auVar43._4_4_ + auVar36._4_4_) * *(float *)((long)afStack_1a6c + lVar25);
    auVar40._8_4_ =
         (auVar46._8_4_ + auVar35._8_4_) * (auVar42._8_4_ + auVar49._8_4_) * 0.5 +
         (auVar43._8_4_ + auVar36._8_4_) * *(float *)((long)afStack_1a6c + lVar25 + 4);
    auVar40._12_4_ =
         (auVar46._12_4_ + auVar35._12_4_) * (auVar42._12_4_ + auVar49._12_4_) * 0.5 +
         (auVar43._12_4_ + auVar36._12_4_) * *(float *)((long)afStack_1a6c + lVar25 + 8);
    auVar46 = vcmpps_avx(auVar40,auVar52,1);
    local_3700 = (anon_class_16_2_ed117de8_conflict16)
                 vblendvps_avx((undefined1  [16])local_3700,auVar53,auVar46);
    auVar52 = vminps_avx(auVar40,auVar52);
    uVar29 = uVar29 + 1;
    auVar53 = vpsubd_avx(auVar53,_DAT_01f46b70);
    lVar25 = lVar25 + 0x10;
    paVar30 = paVar30 + 0xc;
  }
  local_36b0.my_end = auVar52._0_8_;
  local_36b0.my_begin = auVar52._8_8_;
  fVar34 = INFINITY;
  iVar24 = 0;
  for (uVar29 = 0; uVar29 != 3; uVar29 = uVar29 + 1) {
    fVar2 = *(float *)((long)&local_36d0 + uVar29 * 4);
    if ((((fVar2 != 0.0) || (NAN(fVar2))) &&
        (fVar2 = *(float *)((long)&local_36b0.my_end + uVar29 * 4), fVar2 < fVar34)) &&
       (iVar15 = *(int *)((long)&local_3700.reduction + uVar29 * 4), iVar15 != 0)) {
      uVar26 = uVar29 & 0xffffffff;
      iVar24 = iVar15;
      fVar34 = fVar2;
    }
  }
  __return_storage_ptr__->dim = (int)uVar26;
  (__return_storage_ptr__->field_2).pos = iVar24;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = local_36f0._0_8_;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = local_36f0._16_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = local_36f0._24_8_;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_36d0._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = local_36d0._8_8_;
  __return_storage_ptr__->sah =
       fVar34 * ((set->super_PrimInfoMB).time_range.upper - (set->super_PrimInfoMB).time_range.lower
                );
  if ((int)uVar26 == -1) {
    __return_storage_ptr__->data = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set, const size_t logBlockSize)
        {
          ObjectBinner binner(empty);
          const BinMapping<BINS> mapping(set.size(),set.centBounds);
          bin_parallel(binner,set.prims->data(),set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,PARALLEL_THRESHOLD,mapping);
          Split osplit = binner.best(mapping,logBlockSize);
          osplit.sah *= set.time_range.size();
          if (!osplit.valid()) osplit.data = Split::SPLIT_FALLBACK; // use fallback split
          return osplit;
        }